

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_tree.hh
# Opt level: O0

void __thiscall
kp::tree<htmlcxx2::HTML::Node,_std::allocator<kp::tree_node_<htmlcxx2::HTML::Node>_>_>::
pre_order_iterator::pre_order_iterator(pre_order_iterator *this,sibling_iterator *other)

{
  tree_node *ptVar1;
  sibling_iterator *other_local;
  pre_order_iterator *this_local;
  
  iterator_base::iterator_base(&this->super_iterator_base,(other->super_iterator_base).node);
  if ((this->super_iterator_base).node == (tree_node *)0x0) {
    ptVar1 = sibling_iterator::range_last(other);
    if (ptVar1 == (tree_node *)0x0) {
      (this->super_iterator_base).node = other->parent_;
    }
    else {
      ptVar1 = sibling_iterator::range_last(other);
      (this->super_iterator_base).node = ptVar1;
    }
    iterator_base::skip_children(&this->super_iterator_base);
    operator++(this);
  }
  return;
}

Assistant:

tree<T, tree_node_allocator>::pre_order_iterator::pre_order_iterator(const sibling_iterator& other)
    : iterator_base(other.node)
    {
    if(iterator_base::node==0) {
        if(other.range_last()!=0)
			iterator_base::node=other.range_last();
        else 
			iterator_base::node=other.parent_;
		iterator_base::skip_children();
        ++(*this);
        }
    }